

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4289b::updateNames::NameMapper::~NameMapper(NameMapper *this)

{
  NameMapper *this_local;
  
  ~NameMapper(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }